

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O1

REF_STATUS
ref_iso_segment(REF_GRID_conflict ref_grid,REF_DBL *center,REF_DBL aoa,REF_DBL phi,REF_DBL h,
               REF_DBL *segment0,REF_DBL *segment1)

{
  double dVar1;
  double dVar2;
  REF_MPI ref_mpi;
  REF_NODE pRVar3;
  bool bVar4;
  uint uVar5;
  long *plVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  REF_DBL x0;
  REF_DBL x1;
  REF_DBL x;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  ref_mpi = ref_grid->mpi;
  pRVar3 = ref_grid->node;
  local_58 = 1e+200;
  local_50 = -1e+200;
  if (0 < (long)pRVar3->max) {
    dVar14 = -1e+200;
    dVar8 = 1e+200;
    plVar6 = pRVar3->global;
    bVar4 = true;
    lVar7 = 0;
    do {
      if (-1 < *plVar6) {
        if (bVar4) {
          dVar8 = *(double *)((long)pRVar3->real + lVar7);
          dVar14 = *(double *)((long)pRVar3->real + lVar7);
        }
        else {
          dVar9 = *(double *)((long)pRVar3->real + lVar7);
          if (dVar9 <= dVar8) {
            dVar8 = dVar9;
          }
          dVar9 = *(double *)((long)pRVar3->real + lVar7);
          if (dVar14 <= dVar9) {
            dVar14 = dVar9;
          }
        }
        bVar4 = false;
        local_58 = dVar8;
        local_50 = dVar14;
      }
      lVar7 = lVar7 + 0x78;
      plVar6 = plVar6 + 1;
    } while ((long)pRVar3->max * 0x78 - lVar7 != 0);
  }
  uVar5 = ref_mpi_min(ref_mpi,&local_58,&local_48,3);
  if (uVar5 == 0) {
    uVar5 = ref_mpi_bcast(ref_mpi,&local_48,1,3);
    if (uVar5 == 0) {
      local_58 = local_48;
      uVar5 = ref_mpi_max(ref_mpi,&local_50,&local_48,3);
      if (uVar5 == 0) {
        uVar5 = ref_mpi_bcast(ref_mpi,&local_48,1,3);
        if (uVar5 == 0) {
          dVar14 = local_48 - local_58;
          local_58 = dVar14 * -0.1 + local_58;
          local_50 = dVar14 * 0.1 + local_48;
          *segment0 = local_58;
          dVar14 = center[1];
          dVar8 = (phi / 180.0) * 3.14159265358979;
          dVar9 = sin(dVar8);
          segment0[1] = dVar9 * h + dVar14;
          dVar14 = center[2];
          dVar9 = cos(dVar8);
          segment0[2] = dVar14 - dVar9 * h;
          *segment1 = local_50;
          dVar14 = center[1];
          dVar9 = sin(dVar8);
          segment1[1] = dVar9 * h + dVar14;
          dVar14 = center[2];
          dVar8 = cos(dVar8);
          segment1[2] = dVar14 - dVar8 * h;
          dVar14 = *segment0;
          dVar8 = *center;
          *segment0 = dVar14 - dVar8;
          segment0[1] = segment0[1] - center[1];
          segment0[2] = segment0[2] - center[2];
          dVar10 = (aoa / -180.0) * 3.14159265358979;
          dVar11 = cos(dVar10);
          dVar9 = segment0[2];
          dVar12 = sin(dVar10);
          dVar1 = *segment0;
          dVar2 = segment0[1];
          local_38 = sin(dVar10);
          local_40 = segment0[2];
          dVar13 = cos(dVar10);
          *segment0 = dVar11 * (dVar14 - dVar8) + dVar12 * dVar9 + *center;
          segment0[1] = dVar2 + center[1];
          segment0[2] = (dVar13 * local_40 - local_38 * dVar1) + center[2];
          dVar14 = *segment1;
          dVar8 = *center;
          *segment1 = dVar14 - dVar8;
          segment1[1] = segment1[1] - center[1];
          segment1[2] = segment1[2] - center[2];
          dVar11 = cos(dVar10);
          dVar9 = segment1[2];
          dVar12 = sin(dVar10);
          dVar1 = *segment1;
          dVar2 = segment1[1];
          local_38 = sin(dVar10);
          local_40 = segment1[2];
          dVar10 = cos(dVar10);
          *segment1 = dVar11 * (dVar14 - dVar8) + dVar12 * dVar9 + *center;
          segment1[1] = dVar2 + center[1];
          segment1[2] = (dVar10 * local_40 - local_38 * dVar1) + center[2];
          uVar5 = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0x2ec,"ref_iso_segment",(ulong)uVar5,"bcast max");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x2eb
               ,"ref_iso_segment",(ulong)uVar5,"mpi max");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x2e9,
             "ref_iso_segment",(ulong)uVar5,"bcast min");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x2e8,
           "ref_iso_segment",(ulong)uVar5,"mpi min");
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_iso_segment(REF_GRID ref_grid, REF_DBL *center,
                                   REF_DBL aoa, REF_DBL phi, REF_DBL h,
                                   REF_DBL *segment0, REF_DBL *segment1) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_DBL x, x0, x1, dx;
  REF_DBL new_p[3];
  REF_INT node;
  REF_BOOL first;
  x0 = REF_DBL_MAX;
  x1 = REF_DBL_MIN;
  first = REF_TRUE;
  each_ref_node_valid_node(ref_node, node) {
    if (first) {
      first = REF_FALSE;
      x0 = ref_node_xyz(ref_node, 0, node);
      x1 = ref_node_xyz(ref_node, 0, node);
    } else {
      x0 = MIN(x0, ref_node_xyz(ref_node, 0, node));
      x1 = MAX(x1, ref_node_xyz(ref_node, 0, node));
    }
  }
  RSS(ref_mpi_min(ref_mpi, &x0, &x, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &x, 1, REF_DBL_TYPE), "bcast min");
  x0 = x;
  RSS(ref_mpi_max(ref_mpi, &x1, &x, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &x, 1, REF_DBL_TYPE), "bcast max");
  x1 = x;

  dx = x1 - x0;
  x0 -= 0.1 * dx;
  x1 += 0.1 * dx;

  segment0[0] = x0;
  segment0[1] = center[1] + h * sin(ref_math_in_radians(phi));
  segment0[2] = center[2] - h * cos(ref_math_in_radians(phi));

  segment1[0] = x1;
  segment1[1] = center[1] + h * sin(ref_math_in_radians(phi));
  segment1[2] = center[2] - h * cos(ref_math_in_radians(phi));

  segment0[0] -= center[0];
  segment0[1] -= center[1];
  segment0[2] -= center[2];
  new_p[0] = segment0[0] * cos(ref_math_in_radians(-aoa)) +
             segment0[2] * sin(ref_math_in_radians(-aoa));
  new_p[1] = segment0[1];
  new_p[2] = -segment0[0] * sin(ref_math_in_radians(-aoa)) +
             segment0[2] * cos(ref_math_in_radians(-aoa));
  segment0[0] = center[0] + new_p[0];
  segment0[1] = center[1] + new_p[1];
  segment0[2] = center[2] + new_p[2];

  segment1[0] -= center[0];
  segment1[1] -= center[1];
  segment1[2] -= center[2];
  new_p[0] = segment1[0] * cos(ref_math_in_radians(-aoa)) +
             segment1[2] * sin(ref_math_in_radians(-aoa));
  new_p[1] = segment1[1];
  new_p[2] = -segment1[0] * sin(ref_math_in_radians(-aoa)) +
             segment1[2] * cos(ref_math_in_radians(-aoa));
  segment1[0] = center[0] + new_p[0];
  segment1[1] = center[1] + new_p[1];
  segment1[2] = center[2] + new_p[2];

  return REF_SUCCESS;
}